

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

bool __thiscall Tokenizer::tryToGetSingleCharToken(Tokenizer *this)

{
  Mark MVar1;
  byte bVar2;
  bool bVar3;
  Mark *pMVar4;
  long lVar5;
  undefined2 *puVar6;
  undefined1 local_1a1;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  *local_1a0;
  TokenType local_198;
  undefined1 *local_190 [2];
  undefined1 local_180 [16];
  byte local_170;
  Mark local_168;
  undefined2 *local_160;
  undefined8 local_158;
  undefined2 local_150;
  undefined6 uStack_14e;
  undefined2 *local_140;
  undefined8 local_138;
  undefined2 local_130;
  undefined6 uStack_12e;
  undefined2 *local_120;
  undefined8 local_118;
  undefined2 local_110;
  undefined6 uStack_10e;
  undefined2 *local_100;
  undefined8 local_f8;
  undefined2 local_f0;
  undefined6 uStack_ee;
  undefined2 *local_e0;
  undefined8 local_d8;
  undefined2 local_d0;
  undefined6 uStack_ce;
  undefined2 *local_c0;
  undefined8 local_b8;
  undefined2 local_b0;
  undefined6 uStack_ae;
  undefined2 *local_a0;
  undefined8 local_98;
  undefined2 local_90;
  undefined6 uStack_8e;
  undefined2 *local_80;
  undefined8 local_78;
  undefined2 local_70;
  undefined6 uStack_6e;
  undefined2 *local_60;
  undefined8 local_58;
  undefined2 local_50;
  undefined6 uStack_4e;
  undefined2 *local_40;
  undefined8 local_38;
  undefined2 local_30;
  undefined6 uStack_2e;
  
  pMVar4 = Stream::getMark(&this->stream_);
  MVar1 = *pMVar4;
  bVar2 = Stream::peek(&this->stream_);
  bVar3 = false;
  local_168 = MVar1;
  if (bVar2 < 0x3b) {
    switch(bVar2) {
    case 0x25:
      local_130 = 0x25;
      local_138 = 1;
      local_198 = Modulo;
      local_190[0] = local_180;
      local_140 = &local_130;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_130,(long)&local_130 + 1)
      ;
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_140 != &local_130) {
        lVar5 = CONCAT62(uStack_12e,local_130);
        puVar6 = local_140;
LAB_0016438f:
        local_170 = 0xff;
        operator_delete(puVar6,lVar5 + 1);
      }
      break;
    case 0x26:
    case 0x27:
    case 0x2a:
    case 0x2b:
      goto switchD_00163c8f_caseD_26;
    case 0x28:
      local_b0 = 0x28;
      local_b8 = 1;
      local_198 = LParen;
      local_190[0] = local_180;
      local_c0 = &local_b0;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_b0,(long)&local_b0 + 1);
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_c0 != &local_b0) {
        lVar5 = CONCAT62(uStack_ae,local_b0);
        puVar6 = local_c0;
        goto LAB_0016438f;
      }
      break;
    case 0x29:
      local_d0 = 0x29;
      local_d8 = 1;
      local_198 = RParen;
      local_190[0] = local_180;
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_d0,(long)&local_d0 + 1);
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_e0 != &local_d0) {
        lVar5 = CONCAT62(uStack_ce,local_d0);
        puVar6 = local_e0;
        goto LAB_0016438f;
      }
      break;
    case 0x2c:
      local_30 = 0x2c;
      local_38 = 1;
      local_198 = Comma;
      local_190[0] = local_180;
      local_40 = &local_30;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_30,(long)&local_30 + 1);
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_40 != &local_30) {
        lVar5 = CONCAT62(uStack_2e,local_30);
        puVar6 = local_40;
        goto LAB_0016438f;
      }
      break;
    default:
      if (bVar2 != 0x3a) {
        return false;
      }
      local_50 = 0x3a;
      local_58 = 1;
      local_198 = Colon;
      local_190[0] = local_180;
      local_60 = &local_50;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_50,(long)&local_50 + 1);
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_60 != &local_50) {
        lVar5 = CONCAT62(uStack_4e,local_50);
        puVar6 = local_60;
        goto LAB_0016438f;
      }
    }
  }
  else if (bVar2 < 0x7b) {
    if (bVar2 == 0x3b) {
      local_70 = 0x3b;
      local_78 = 1;
      local_198 = Semicolon;
      local_190[0] = local_180;
      local_80 = &local_70;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_70,(long)&local_70 + 1);
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_80 != &local_70) {
        lVar5 = CONCAT62(uStack_6e,local_70);
        puVar6 = local_80;
        goto LAB_0016438f;
      }
    }
    else {
      if (bVar2 != 0x5c) {
        return false;
      }
      local_90 = 0x5c;
      local_98 = 1;
      local_198 = Backslash;
      local_190[0] = local_180;
      local_a0 = &local_90;
      std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_90,(long)&local_90 + 1);
      local_170 = 0;
      (this->token_).type = local_198;
      local_1a0 = &(this->token_).value;
      std::operator=(&local_1a0,(string *)local_190,&local_1a1);
      (this->token_).mark = local_168;
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
        ::_S_vtable._M_arr[local_170]._M_data)
                ((anon_class_1_0_00000001 *)&local_1a0,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                  *)local_190);
      local_170 = 0xff;
      if (local_a0 != &local_90) {
        lVar5 = CONCAT62(uStack_8e,local_90);
        puVar6 = local_a0;
        goto LAB_0016438f;
      }
    }
  }
  else if (bVar2 == 0x7b) {
    local_f0 = 0x7b;
    local_f8 = 1;
    local_198 = LBrace;
    local_190[0] = local_180;
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_f0,(long)&local_f0 + 1);
    local_170 = 0;
    (this->token_).type = local_198;
    local_1a0 = &(this->token_).value;
    std::operator=(&local_1a0,(string *)local_190,&local_1a1);
    (this->token_).mark = local_168;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_170]._M_data)
              ((anon_class_1_0_00000001 *)&local_1a0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_190);
    local_170 = 0xff;
    if (local_100 != &local_f0) {
      lVar5 = CONCAT62(uStack_ee,local_f0);
      puVar6 = local_100;
      goto LAB_0016438f;
    }
  }
  else if (bVar2 == 0x7d) {
    local_110 = 0x7d;
    local_118 = 1;
    local_198 = RBrace;
    local_190[0] = local_180;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_110,(long)&local_110 + 1);
    local_170 = 0;
    (this->token_).type = local_198;
    local_1a0 = &(this->token_).value;
    std::operator=(&local_1a0,(string *)local_190,&local_1a1);
    (this->token_).mark = local_168;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_170]._M_data)
              ((anon_class_1_0_00000001 *)&local_1a0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_190);
    local_170 = 0xff;
    if (local_120 != &local_110) {
      lVar5 = CONCAT62(uStack_10e,local_110);
      puVar6 = local_120;
      goto LAB_0016438f;
    }
  }
  else {
    if (bVar2 != 0x7e) {
      return false;
    }
    local_150 = 0x7e;
    local_158 = 1;
    local_198 = BinaryNot;
    local_190[0] = local_180;
    local_160 = &local_150;
    std::__cxx11::string::_M_construct<char*>((string *)local_190,&local_150,(long)&local_150 + 1);
    local_170 = 0;
    (this->token_).type = local_198;
    local_1a0 = &(this->token_).value;
    std::operator=(&local_1a0,(string *)local_190,&local_1a1);
    (this->token_).mark = local_168;
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_&>
      ::_S_vtable._M_arr[local_170]._M_data)
              ((anon_class_1_0_00000001 *)&local_1a0,
               (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                *)local_190);
    local_170 = 0xff;
    if (local_160 != &local_150) {
      lVar5 = CONCAT62(uStack_14e,local_150);
      puVar6 = local_160;
      goto LAB_0016438f;
    }
  }
  Stream::advance(&this->stream_);
  bVar3 = true;
switchD_00163c8f_caseD_26:
  return bVar3;
}

Assistant:

bool Tokenizer::tryToGetSingleCharToken()
{
  const Mark mark = stream_.getMark();
  switch(stream_.peek())
  {
    case ',':
      token_ = Token{TokenType::Comma, ",", mark};
      break;
    case ':':
      token_ = Token{TokenType::Colon, ":", mark};
      break;
    case ';':
      token_ = Token{TokenType::Semicolon, ";", mark};
      break;
    case '\\':
      token_ = Token{TokenType::Backslash, "\\", mark};
      break;
    case '(':
      token_ = Token{TokenType::LParen, "(", mark};
      break;
    case ')':
      token_ = Token{TokenType::RParen, ")", mark};
      break;
    case '{':
      token_ = Token{TokenType::LBrace, "{", mark};
      break;
    case '}':
      token_ = Token{TokenType::RBrace, "}", mark};
      break;
    case '%':
      token_ = Token{TokenType::Modulo, "%", mark};
      break;
    case '~':
      token_ = Token{TokenType::BinaryNot, "~", mark};
      break;
    default:
      return false;
  }
  stream_.advance();
  return true;
}